

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  _Bool cpu_fine_clip)

{
  uint *puVar1;
  float fVar2;
  char cVar3;
  ushort uVar4;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  wchar_t wVar8;
  size_t sVar9;
  void *pvVar10;
  char *pcVar11;
  long lVar12;
  ImFontGlyph *pIVar13;
  char *text_end_00;
  ImDrawIdx IVar14;
  char *pcVar15;
  char *in_text;
  float scale;
  float fVar16;
  float fVar17;
  float fVar18;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  uint c;
  uint local_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ulong local_a0;
  ImDrawIdx *local_98;
  ImDrawVert *local_90;
  uint local_84;
  int local_80;
  wchar_t local_7c;
  float local_78;
  undefined1 local_68 [24];
  char *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar32 = pos.y;
  local_78 = wrap_width;
  if (text_end == (char *)0x0) {
    sVar9 = strlen(text_begin);
    text_end = text_begin + sVar9;
  }
  local_b8 = (float)(int)fVar32;
  fVar20 = (float)(int)fVar32;
  fVar21 = (float)(int)fVar32;
  fVar22 = (float)(int)fVar32;
  fVar33 = clip_rect->w;
  if (local_b8 <= fVar33) {
    scale = size / this->FontSize;
    fVar18 = this->FontSize * scale;
    fVar16 = local_b8 + fVar18;
    local_68._0_16_ = ZEXT416((uint)clip_rect->y);
    fStack_b4 = fVar20;
    fStack_b0 = fVar21;
    fStack_ac = fVar22;
    if (text_begin < text_end && (fVar16 < clip_rect->y && local_78 <= 0.0)) {
      do {
        local_b8 = fVar16;
        fStack_b4 = fVar20;
        fStack_b0 = fVar21;
        fStack_ac = fVar22;
        pvVar10 = memchr(text_begin,10,(long)text_end - (long)text_begin);
        text_begin = (char *)((long)pvVar10 + 1);
        if (pvVar10 == (void *)0x0) {
          text_begin = text_end;
        }
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        fVar16 = fVar18 + local_b8;
      } while ((fVar16 < (float)local_68._0_4_) && (text_begin < text_end));
    }
    text_end_00 = text_end;
    if ((local_78 <= 0.0) &&
       (pcVar11 = text_begin, fVar20 = local_b8, 10000 < (long)text_end - (long)text_begin)) {
      while ((text_end_00 = pcVar11, fVar20 < fVar33 && (pcVar11 < text_end))) {
        local_68._0_4_ = fVar20;
        pvVar10 = memchr(pcVar11,10,(long)text_end - (long)pcVar11);
        pcVar11 = (char *)((long)pvVar10 + 1);
        if (pvVar10 == (void *)0x0) {
          pcVar11 = text_end;
        }
        fVar20 = (float)local_68._0_4_ + fVar18;
      }
    }
    if (text_begin != text_end_00) {
      local_48 = (float)(int)pos.x;
      fStack_44 = (float)(int)fVar32;
      fStack_40 = (float)(int)in_XMM1_Dc;
      fStack_3c = (float)(int)in_XMM1_Dd;
      iVar7 = (int)text_end_00 - (int)text_begin;
      local_80 = iVar7 * 6;
      local_7c = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_80,iVar7 * 4);
      local_90 = draw_list->_VtxWritePtr;
      local_98 = draw_list->_IdxWritePtr;
      local_a0 = (ulong)draw_list->_VtxCurrentIdx;
      local_84 = col | 0xffffff;
      local_50 = (char *)0x0;
      fVar32 = local_48;
      fVar33 = local_78;
      fVar20 = local_48;
      fVar21 = local_b8;
      fVar22 = fStack_b4;
      fVar16 = fStack_b0;
      fVar17 = fStack_ac;
      pcVar11 = local_50;
      fVar30 = local_48;
      pcVar15 = text_begin;
joined_r0x00204568:
      do {
        if (text_end_00 <= text_begin) break;
        in_text = pcVar15;
        fVar31 = fVar30;
        fVar27 = local_b8;
        fVar2 = fStack_b4;
        fVar28 = fStack_b0;
        fVar19 = fStack_ac;
        pcVar6 = local_50;
        if (0.0 < fVar33) {
          if (pcVar11 == (char *)0x0) {
            local_68._0_4_ = fVar21;
            pcVar11 = CalcWordWrapPositionA
                                (this,scale,text_begin,text_end_00,(fVar20 - fVar32) + fVar33);
            fVar22 = 0.0;
            fVar16 = 0.0;
            fVar17 = 0.0;
            pcVar11 = pcVar11 + (pcVar11 == text_begin);
            fVar21 = (float)local_68._0_4_;
            fVar33 = local_78;
            fVar20 = local_48;
          }
          in_text = text_begin;
          fVar31 = fVar32;
          fVar27 = fVar21;
          fVar2 = fVar22;
          fVar28 = fVar16;
          fVar19 = fVar17;
          pcVar6 = pcVar11;
          if (pcVar11 <= text_begin) {
            pcVar11 = text_begin;
            if (text_begin < text_end_00) {
              lVar12 = (long)text_end_00 - (long)text_begin;
              do {
                cVar3 = *text_begin;
                if ((cVar3 != ' ') && (cVar3 != '\t')) {
                  pcVar11 = text_begin;
                  if (cVar3 == '\n') {
                    pcVar11 = text_begin + 1;
                  }
                  break;
                }
                text_begin = text_begin + 1;
                lVar12 = lVar12 + -1;
                pcVar11 = text_end_00;
              } while (lVar12 != 0);
            }
            text_begin = pcVar11;
            fVar32 = fVar20;
            fVar21 = fVar21 + fVar18;
            pcVar11 = (char *)0x0;
            goto joined_r0x00204568;
          }
        }
        local_50 = pcVar6;
        fStack_ac = fVar19;
        fStack_b0 = fVar28;
        fStack_b4 = fVar2;
        local_b8 = fVar27;
        local_bc = (uint)*in_text;
        if (*in_text < '\0') {
          iVar7 = ImTextCharFromUtf8(&local_bc,in_text,text_end_00);
          if (local_bc == 0) break;
          text_begin = in_text + iVar7;
          fVar33 = local_78;
          fVar20 = local_48;
        }
        else {
          text_begin = in_text + 1;
        }
        fVar21 = local_b8;
        fVar32 = fVar31;
        fVar22 = fStack_b4;
        fVar16 = fStack_b0;
        fVar17 = fStack_ac;
        pcVar11 = local_50;
        fVar30 = fVar31;
        pcVar15 = text_begin;
        if (0x1f < local_bc) {
LAB_002046ef:
          if (((local_bc & 0xffff) < (uint)(this->IndexLookup).Size) &&
             (uVar4 = (this->IndexLookup).Data[local_bc & 0xffff], uVar4 != 0xffff)) {
            pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar4 * 0x28);
          }
          else {
            pIVar13 = this->FallbackGlyph;
          }
          if (pIVar13 != (ImFontGlyph *)0x0) {
            fVar32 = pIVar13->AdvanceX;
            if (((undefined1  [40])*pIVar13 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
              fVar27 = pIVar13->X0 * scale + fVar31;
              fVar30 = clip_rect->z;
              if (fVar27 <= fVar30) {
                fVar28 = pIVar13->X1 * scale + fVar31;
                fVar2 = clip_rect->x;
                if (fVar2 <= fVar28) {
                  fVar29 = pIVar13->Y0 * scale + local_b8;
                  fVar24 = pIVar13->Y1 * scale + local_b8;
                  fVar19 = pIVar13->U0;
                  fVar26 = pIVar13->V0;
                  fVar25 = pIVar13->U1;
                  fVar23 = pIVar13->V1;
                  if (cpu_fine_clip) {
                    if (fVar27 < fVar2) {
                      fVar19 = fVar19 + (fVar25 - fVar19) *
                                        (1.0 - (fVar28 - fVar2) / (fVar28 - fVar27));
                      fVar27 = fVar2;
                    }
                    fVar2 = clip_rect->y;
                    if (fVar29 < fVar2) {
                      fVar26 = fVar26 + (fVar23 - fVar26) *
                                        (1.0 - (fVar24 - fVar2) / (fVar24 - fVar29));
                      fVar29 = fVar2;
                    }
                    if (fVar30 < fVar28) {
                      fVar25 = (fVar25 - fVar19) * ((fVar30 - fVar27) / (fVar28 - fVar27)) + fVar19;
                      fVar28 = fVar30;
                    }
                    fVar30 = clip_rect->w;
                    if (fVar30 < fVar24) {
                      fVar23 = (fVar23 - fVar26) * ((fVar30 - fVar29) / (fVar24 - fVar29)) + fVar26;
                      fVar24 = fVar30;
                    }
                    if (fVar24 <= fVar29) goto LAB_00204986;
                  }
                  uVar5 = local_84;
                  if (((undefined1  [40])*pIVar13 & (undefined1  [40])0x1) == (undefined1  [40])0x0)
                  {
                    uVar5 = col;
                  }
                  IVar14 = (ImDrawIdx)local_a0;
                  *local_98 = IVar14;
                  local_98[1] = IVar14 + 1;
                  local_98[2] = IVar14 + 2;
                  local_98[3] = IVar14;
                  local_98[4] = IVar14 + 2;
                  local_98[5] = IVar14 + 3;
                  (local_90->pos).x = fVar27;
                  (local_90->pos).y = fVar29;
                  local_90->col = uVar5;
                  (local_90->uv).x = fVar19;
                  (local_90->uv).y = fVar26;
                  local_90[1].pos.x = fVar28;
                  local_90[1].pos.y = fVar29;
                  local_90[1].col = uVar5;
                  local_90[1].uv.x = fVar25;
                  local_90[1].uv.y = fVar26;
                  local_90[2].pos.x = fVar28;
                  local_90[2].pos.y = fVar24;
                  local_90[2].col = uVar5;
                  local_90[2].uv.x = fVar25;
                  local_90[2].uv.y = fVar23;
                  local_90[3].pos.x = fVar27;
                  local_90[3].pos.y = fVar24;
                  local_90[3].col = uVar5;
                  local_90[3].uv.x = fVar19;
                  local_90[3].uv.y = fVar23;
                  local_90 = local_90 + 4;
                  local_a0 = (ulong)((int)local_a0 + 4);
                  local_98 = local_98 + 6;
                }
              }
            }
LAB_00204986:
            fVar32 = fVar31 + fVar32 * scale;
            fVar30 = fVar32;
          }
          goto joined_r0x00204568;
        }
        if (local_bc != 10) {
          if (local_bc != 0xd) goto LAB_002046ef;
          goto joined_r0x00204568;
        }
        local_b8 = local_b8 + fVar18;
        fVar32 = fVar20;
        fVar21 = local_b8;
        fVar30 = fVar20;
      } while (local_b8 < clip_rect->w || local_b8 == clip_rect->w);
      (draw_list->VtxBuffer).Size =
           (int)((ulong)((long)local_90 - (long)(draw_list->VtxBuffer).Data) >> 2) * -0x33333333;
      wVar8 = (wchar_t)((ulong)((long)local_98 - (long)(draw_list->IdxBuffer).Data) >> 1);
      (draw_list->IdxBuffer).Size = wVar8;
      lVar12 = (long)(draw_list->CmdBuffer).Size;
      if (lVar12 < 1) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                      ,0x706,"T &ImVector<ImDrawCmd>::operator[](int) [T = ImDrawCmd]");
      }
      puVar1 = &(draw_list->CmdBuffer).Data[lVar12 + -1].ElemCount;
      *puVar1 = *puVar1 + (wVar8 - (local_7c + local_80));
      draw_list->_VtxWritePtr = local_90;
      draw_list->_IdxWritePtr = local_98;
      draw_list->_VtxCurrentIdx = (uint)local_a0;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = IM_FLOOR(pos.x);
    pos.y = IM_FLOOR(pos.y);
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    const ImU32 col_untinted = col | ~IM_COL32_A_MASK;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x + glyph->X0 * scale;
            float x2 = x + glyph->X1 * scale;
            float y1 = y + glyph->Y0 * scale;
            float y2 = y + glyph->Y1 * scale;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                // Support for untinted glyphs
                ImU32 glyph_col = glyph->Colored ? col_untinted : col;

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                    idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = glyph_col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = glyph_col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = glyph_col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = glyph_col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    vtx_write += 4;
                    vtx_current_idx += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}